

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

size_t countTags(TestStream *input,uint64_t tagToCount)

{
  long lVar1;
  bool bVar2;
  Range *this;
  unsigned_long uVar3;
  unsigned_long in_RSI;
  long *in_RDI;
  uint64_t tag;
  Range payload;
  size_t oldReadPos;
  size_t result;
  size_t local_18;
  
  local_18 = 0;
  lVar1 = in_RDI[4];
  while( true ) {
    this = (Range *)(**(code **)(*in_RDI + 0x10))();
    bVar2 = binlog::Range::operator_cast_to_bool((Range *)&stack0xffffffffffffffd0);
    if (!bVar2) break;
    uVar3 = binlog::Range::read<unsigned_long>(this);
    if (uVar3 == in_RSI) {
      local_18 = local_18 + 1;
    }
  }
  in_RDI[4] = lVar1;
  return local_18;
}

Assistant:

std::size_t countTags(TestStream& input, std::uint64_t tagToCount)
{
  std::size_t result = 0;
  const std::size_t oldReadPos = input.readPos;

  while (binlog::Range payload = input.nextEntryPayload())
  {
    const std::uint64_t tag = payload.read<std::uint64_t>();
    if (tag == tagToCount) { ++result; }
  }

  input.readPos = oldReadPos;

  return result;
}